

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBuilder.h
# Opt level: O0

uint32_t aeron::BufferBuilder::findSuitableCapacity
                   (uint32_t currentCapacity,uint32_t requiredCapacity)

{
  uint uVar1;
  IllegalStateException *this;
  char *pcVar2;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  uint local_18;
  uint local_14;
  uint32_t newCapacity;
  uint32_t capacity;
  uint32_t requiredCapacity_local;
  uint32_t currentCapacity_local;
  
  local_14 = currentCapacity;
  do {
    local_18 = local_14 + (local_14 >> 1);
    if ((local_18 < local_14) || (uVar1 = local_18, 0xfffffff7 < local_18)) {
      if (local_14 == 0xfffffff7) {
        newCapacity = requiredCapacity;
        capacity = currentCapacity;
        this = (IllegalStateException *)__cxa_allocate_exception(0x48);
        std::__cxx11::to_string(&local_58,0xfffffff7);
        std::operator+(&local_38,"max capacity reached: ",&local_58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_88,
                   "static std::uint32_t aeron::BufferBuilder::findSuitableCapacity(std::uint32_t, std::uint32_t)"
                   ,&local_89);
        pcVar2 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                   ,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O0/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/BufferBuilder.h"
                                  );
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_b0,pcVar2,&local_b1);
        util::IllegalStateException::IllegalStateException(this,&local_38,&local_88,&local_b0,0x68);
        __cxa_throw(this,&util::IllegalStateException::typeinfo,
                    util::IllegalStateException::~IllegalStateException);
      }
      local_14 = 0xfffffff7;
      uVar1 = local_14;
    }
    local_14 = uVar1;
  } while (local_14 < requiredCapacity);
  return local_14;
}

Assistant:

inline static std::uint32_t findSuitableCapacity(std::uint32_t currentCapacity, std::uint32_t requiredCapacity)
    {
        std::uint32_t capacity = currentCapacity;

        do
        {
            const std::uint32_t newCapacity = capacity + (capacity >> 1);

            if (newCapacity < capacity || newCapacity > BUFFER_BUILDER_MAX_CAPACITY)
            {
                if (capacity == BUFFER_BUILDER_MAX_CAPACITY)
                {
                    throw util::IllegalStateException(
                        "max capacity reached: " + std::to_string(BUFFER_BUILDER_MAX_CAPACITY), SOURCEINFO);
                }

                capacity = BUFFER_BUILDER_MAX_CAPACITY;
            }
            else
            {
                capacity = newCapacity;
            }
        }
        while (capacity < requiredCapacity);

        return capacity;
    }